

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O1

int bmp_read_1bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int current_byte;
  int index;
  int local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  ulong local_40;
  gdIOCtxPtr local_38;
  
  local_4c = 0;
  local_50 = 0;
  if (info->enctype == 0) {
    if (info->numcolors == 0) {
      info->numcolors = 2;
    }
    else if (2 < (uint)info->numcolors) {
      return 1;
    }
    iVar2 = bmp_read_palette(im,infile,info->numcolors,(uint)(info->type == 2));
    if (iVar2 == 0) {
      im->colorsTotal = info->numcolors;
      lVar5 = gdTell(infile);
      if ((lVar5 == header->off) || (iVar2 = gdSeek(infile,header->off), iVar2 != 0)) {
        iVar4 = info->height;
        iVar2 = info->width + 7;
        iVar3 = info->width + 0xe;
        if (-1 < iVar2) {
          iVar3 = iVar2;
        }
        iVar2 = (iVar3 >> 3) % 4;
        uVar7 = 4 - iVar2;
        if (iVar2 == 0) {
          uVar7 = 0;
        }
        local_40 = (ulong)uVar7;
        if (0 < iVar4) {
          local_48 = uVar7 + 1;
          local_44 = 0;
          local_38 = infile;
          do {
            uVar7 = ~local_44 + iVar4;
            if (info->topdown != '\0') {
              uVar7 = local_44;
            }
            if (0 < info->width) {
              iVar2 = 0;
              do {
                iVar4 = gdGetByte(&local_50,infile);
                if (iVar4 == 0) {
                  return 1;
                }
                uVar6 = 0;
                do {
                  bVar1 = (byte)(local_50 << ((byte)uVar6 & 0x1f)) >> 7;
                  local_4c = (uint)bVar1;
                  if (im->open[bVar1] != 0) {
                    im->open[bVar1] = 0;
                  }
                  gdImageSetPixel(im,iVar2 + uVar6,uVar7,local_4c);
                } while (((int)(iVar2 + uVar6) < info->width) &&
                        (bVar8 = uVar6 < 7, uVar6 = uVar6 + 1, bVar8));
                iVar2 = iVar2 + 8;
                infile = local_38;
              } while (iVar2 < info->width);
            }
            iVar2 = local_48;
            if (0 < (int)local_40) {
              do {
                iVar4 = gdGetByte((int *)&local_4c,infile);
                if (iVar4 == 0) {
                  return 1;
                }
                iVar2 = iVar2 + -1;
              } while (1 < iVar2);
            }
            local_44 = local_44 + 1;
            iVar4 = info->height;
          } while ((int)local_44 < iVar4);
          return 0;
        }
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int bmp_read_1bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0, current_byte = 0, bit = 0;

	if (info->enctype != BMP_BI_RGB) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 2;
	} else if (info->numcolors < 0 || info->numcolors > 2) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be weird but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		if (!gdSeek(infile, header->off)) {
			return 1;
		}
	}

	/* The line must be aligned on a 32 bits word, else it is padded with zeros */
	padding = (info->width + 7) / 8 % 4;
	if (padding) {
		padding = 4 - padding;
	}

	for (ypos = 0; ypos < info->height; ++ypos) {
		if (info->topdown) {
			row = ypos;
		} else {
			row = info->height - ypos - 1;
		}

		for (xpos = 0; xpos < info->width; xpos += 8) {
			/* Bitmaps are always aligned in bytes so we'll never overflow */
			if (!gdGetByte(&current_byte, infile)) {
				return 1;
			}

			for (bit = 0; bit < 8; bit++) {
				index = ((current_byte & (0x80 >> bit)) != 0 ? 0x01 : 0x00);
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos + bit, row, index);
				/* No need to read anything extra */
				if ((xpos + bit) >= info->width) {
					break;
				}
			}
		}

		for (xpos = padding; xpos > 0; --xpos) {
			if (!gdGetByte(&index, infile)) {
				return 1;
			}
		}
	}
	return 0;
}